

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void communicate(char *file_memory,Arguments *args)

{
  int iVar1;
  Benchmarks bench;
  
  mmap_wait(file_memory);
  setup_benchmarks(&bench);
  for (iVar1 = 0; iVar1 < args->count; iVar1 = iVar1 + 1) {
    bench.single_start = now();
    memset(file_memory,0x2a,(long)args->size);
    LOCK();
    *file_memory = 'c';
    UNLOCK();
    mmap_wait(file_memory);
    benchmark(&bench);
  }
  evaluate(&bench,args);
  return;
}

Assistant:

void communicate(char *file_memory, struct Arguments *args) {
	struct Benchmarks bench;
	int message;
	void *buffer = malloc(args->size);
	atomic_char *guard = (atomic_char *)file_memory;

	mmap_wait(guard);
	setup_benchmarks(&bench);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		memset(file_memory, '*', args->size);

		mmap_notify(guard);
		mmap_wait(guard);

		memcpy(buffer, file_memory, args->size);

		benchmark(&bench);
	}

	evaluate(&bench, args);
	free(buffer);
}